

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::FamilyTest_reject_summary_with_quantile_label_Test::TestBody
          (FamilyTest_reject_summary_with_quantile_label_Test *this)

{
  bool bVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l_00;
  allocator local_181;
  AssertHelper local_180;
  Quantiles quantiles;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  Labels labels;
  Family<prometheus::Summary> family;
  
  std::__cxx11::string::string((string *)&labels,"name",(allocator *)&local_180);
  std::__cxx11::string::string((string *)&quantiles,"help",&local_181);
  local_158.first.field_2._8_8_ = &local_158.first._M_string_length;
  local_158.first._M_dataplus._M_p = (pointer)0x0;
  local_158.first._M_string_length = 0;
  local_158.first.field_2._M_allocated_capacity = 0;
  local_158.second._M_string_length = 0;
  local_158.second._M_dataplus._M_p = (pointer)local_158.first.field_2._8_8_;
  Family<prometheus::Summary>::Family
            (&family,(string *)&labels,(string *)&quantiles,(Labels *)&local_158);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_158);
  std::__cxx11::string::~string((string *)&quantiles);
  std::__cxx11::string::~string((string *)&labels);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[5],_true>
            (&local_158,(char (*) [9])0x16bec8,(char (*) [5])0x16a870);
  __l._M_len = 1;
  __l._M_array = &local_158;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&labels,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &quantiles,(allocator_type *)&local_180);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_158);
  detail::CKMSQuantiles::Quantile::Quantile((Quantile *)&local_158,0.5,0.05);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_158;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&quantiles,__l_00,(allocator_type *)&local_180);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Family<prometheus::Summary>::
      Add<std::vector<prometheus::detail::CKMSQuantiles::Quantile,std::allocator<prometheus::detail::CKMSQuantiles::Quantile>>&>
                (&family,&labels,&quantiles);
    }
  }
  testing::Message::Message((Message *)&local_158);
  testing::internal::AssertHelper::AssertHelper
            (&local_180,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/family_test.cc"
             ,0x8e,
             "Expected: family.Add(labels, quantiles) throws an exception.\n  Actual: it doesn\'t.")
  ;
  testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_158);
  testing::internal::AssertHelper::~AssertHelper(&local_180);
  if ((long *)local_158.first._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_158.first._M_dataplus._M_p + 8))();
  }
  std::
  _Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~_Vector_base(&quantiles.
                   super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
                 );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&labels._M_t);
  Family<prometheus::Summary>::~Family(&family);
  return;
}

Assistant:

TEST(FamilyTest, reject_summary_with_quantile_label) {
  Family<Summary> family{"name", "help", {}};
  auto labels = Labels{{"quantile", "test"}};
  auto quantiles = Summary::Quantiles{{0.5, 0.05}};
  EXPECT_ANY_THROW(family.Add(labels, quantiles));
}